

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

void test_SEND_TCP_DATA_check(void)

{
  int32_t iVar1;
  uint8_t buf4 [5];
  uint8_t buf5 [6];
  uint8_t buf3 [11];
  uint8_t buf2 [11];
  uint8_t buf1 [11];
  PipeMsg msg;
  
  MsgHelper::initMsg(&msg,SEND_TCP_DATA);
  buf1[0] = '\x03';
  buf1[1] = '\x02';
  buf1[2] = '\0';
  buf1[3] = '\0';
  buf1[4] = '\0';
  buf1[5] = '\n';
  buf1[6] = '\x01';
  buf1[7] = '\x02';
  buf1[8] = '\x03';
  buf1[9] = '\x04';
  buf1[10] = '\x05';
  iVar1 = MsgHelper::deserializeMsg(buf1,0xb,&msg);
  if (iVar1 != 10) {
    __assert_fail("MsgHelper::deserializeMsg(buf1, sizeof(buf1), &msg) == 10",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/tkzcfc[P]vpn_uv/test/main.cpp"
                  ,0xf5,"void test_SEND_TCP_DATA_check()");
  }
  MsgHelper::destroyMsg(&msg);
  buf2[0] = '\x03';
  buf2[1] = '\0';
  buf2[2] = '\0';
  buf2[3] = '\0';
  buf2[4] = '\0';
  buf2[5] = '\n';
  buf2[6] = '\x01';
  buf2[7] = '\x02';
  buf2[8] = '\x03';
  buf2[9] = '\x04';
  buf2[10] = '\x05';
  iVar1 = MsgHelper::deserializeMsg(buf2,0xb,&msg);
  if (iVar1 != -1) {
    __assert_fail("MsgHelper::deserializeMsg(buf2, sizeof(buf2), &msg) == -1",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/tkzcfc[P]vpn_uv/test/main.cpp"
                  ,0xfa,"void test_SEND_TCP_DATA_check()");
  }
  MsgHelper::destroyMsg(&msg);
  buf3[0] = '\x03';
  buf3[1] = '\x02';
  buf3[2] = '\0';
  buf3[3] = '\0';
  buf3[4] = '\0';
  buf3[5] = '\x06';
  buf3[6] = '\x01';
  buf3[7] = '\x02';
  buf3[8] = '\x03';
  buf3[9] = '\x04';
  buf3[10] = '\x05';
  iVar1 = MsgHelper::deserializeMsg(buf3,0xb,&msg);
  if (iVar1 != -1) {
    __assert_fail("MsgHelper::deserializeMsg(buf3, sizeof(buf3), &msg) == -1",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/tkzcfc[P]vpn_uv/test/main.cpp"
                  ,0xff,"void test_SEND_TCP_DATA_check()");
  }
  MsgHelper::destroyMsg(&msg);
  builtin_memcpy(buf4,"\x03\x02\x03\x03\x03",5);
  iVar1 = MsgHelper::deserializeMsg(buf4,5,&msg);
  if (iVar1 == 0) {
    MsgHelper::destroyMsg(&msg);
    builtin_memcpy(buf5,"\x03\x02\x03\x13#3",6);
    iVar1 = MsgHelper::deserializeMsg(buf5,6,&msg);
    if (iVar1 == -1) {
      MsgHelper::destroyMsg(&msg);
      return;
    }
    __assert_fail("MsgHelper::deserializeMsg(buf5, sizeof(buf5), &msg) == -1",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/tkzcfc[P]vpn_uv/test/main.cpp"
                  ,0x108,"void test_SEND_TCP_DATA_check()");
  }
  __assert_fail("MsgHelper::deserializeMsg(buf4, sizeof(buf4), &msg) == 0",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/tkzcfc[P]vpn_uv/test/main.cpp"
                ,0x103,"void test_SEND_TCP_DATA_check()");
}

Assistant:

void test_SEND_TCP_DATA_check()
{
	PipeMsg msg;
	MsgHelper::initMsg(&msg, PIPEMSG_TYPE::SEND_TCP_DATA);
	
	const uint8_t buf1[] = {0x03, 0x02, 0x00, 0x00, 0x00, 0x0A, 0x01, 0x02, 0x03, 0x04, 0x05};
	assert(MsgHelper::deserializeMsg(buf1, sizeof(buf1), &msg) == 10);
	MsgHelper::destroyMsg(&msg);
	
	// error: method(0x00)
	const uint8_t buf2[] = {0x03, 0x00, 0x00, 0x00, 0x00, 0x0A, 0x01, 0x02, 0x03, 0x04, 0x05};
	assert(MsgHelper::deserializeMsg(buf2, sizeof(buf2), &msg) == -1);
	MsgHelper::destroyMsg(&msg);
	
	// error: len(0x06) < min
	const uint8_t buf3[] = {0x03, 0x02, 0x00, 0x00, 0x00, 0x06, 0x01, 0x02, 0x03, 0x04, 0x05};
	assert(MsgHelper::deserializeMsg(buf3, sizeof(buf3), &msg) == -1);
	MsgHelper::destroyMsg(&msg);
	
	const uint8_t buf4[] = {0x03, 0x02, 0x03, 0x03, 0x03};
	assert(MsgHelper::deserializeMsg(buf4, sizeof(buf4), &msg) == 0);
	MsgHelper::destroyMsg(&msg);
	
	// error: len(0x03131233) overflow
	const uint8_t buf5[] = {0x03, 0x02, 0x03, 0x13, 0x23, 0x33};
	assert(MsgHelper::deserializeMsg(buf5, sizeof(buf5), &msg) == -1);
	MsgHelper::destroyMsg(&msg);
}